

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O0

int __thiscall despot::FVRS::GetObservation(FVRS *this,double rand_num,RockSampleState *rockstate)

{
  bool bVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  double dVar4;
  __type _Var5;
  bool local_49;
  bool bit;
  double efficiency;
  double distance;
  int rock;
  int obs;
  RockSampleState *rockstate_local;
  double rand_num_local;
  FVRS *this_local;
  
  distance._4_4_ = 0;
  distance._0_4_ = 0;
  _rock = &rockstate->super_State;
  rockstate_local = (RockSampleState *)rand_num;
  rand_num_local = (double)this;
  for (; distance._0_4_ < (this->super_BaseRockSample).num_rocks_;
      distance._0_4_ = distance._0_4_ + 1) {
    uVar2 = BaseRockSample::GetRobPos(&this->super_BaseRockSample,_rock);
    pvVar3 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&(this->super_BaseRockSample).rock_pos_,(long)distance._0_4_);
    dVar4 = (double)despot::Coord::EuclideanDistance(uVar2,*(undefined8 *)pvVar3);
    _Var5 = std::pow<int,double>(2,-dVar4 / (this->super_BaseRockSample).half_efficiency_distance_);
    dVar4 = (_Var5 + 1.0) * 0.5;
    if (dVar4 <= (double)rockstate_local) {
      bVar1 = BaseRockSample::GetRock(&this->super_BaseRockSample,_rock,distance._0_4_);
      local_49 = (bool)((bVar1 ^ 0xffU) & 1);
      rockstate_local = (RockSampleState *)((double)rockstate_local - dVar4);
      if (dVar4 < 1.0) {
        rockstate_local =
             (RockSampleState *)((double)rockstate_local / (1.0 - (double)rockstate_local));
      }
    }
    else {
      local_49 = BaseRockSample::GetRock(&this->super_BaseRockSample,_rock,distance._0_4_);
    }
    if (local_49 != false) {
      SetFlag((int *)((long)&distance + 4),distance._0_4_);
    }
  }
  return distance._4_4_;
}

Assistant:

int FVRS::GetObservation(double rand_num,
	const RockSampleState& rockstate) const {
	int obs = 0;
	for (int rock = 0; rock < num_rocks_; rock++) {
		double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
			rock_pos_[rock]);
		double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
			* 0.5;

		// cout << efficiency << endl;
		bool bit = 0;
		if (rand_num < efficiency) {
			bit = GetRock(&rockstate, rock) & E_GOOD;
		} else {
			bit = !(GetRock(&rockstate, rock) & E_GOOD);

			rand_num -= efficiency;
			if (efficiency < 1.0)
				rand_num /= (1.0 - rand_num);
		}

		if (bit)
			SetFlag(obs, rock);
	}
	return obs;
}